

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.cpp
# Opt level: O2

void __thiscall ThreadPool::resize(ThreadPool *this,size_t threads)

{
  pointer *ppuVar1;
  mutex *__mutex;
  pointer puVar2;
  ulong uVar3;
  pointer puVar4;
  imageException *this_00;
  unique_lock<std::mutex> _mutexLock;
  ulong local_40;
  ThreadPool *local_38;
  
  if (threads != 0) {
    uVar3 = (long)(this->_worker).super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(this->_worker).super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                  _M_impl.super__Vector_impl_data._M_start >> 3;
    if (uVar3 < threads) {
      std::mutex::lock(&this->_taskInfo);
      _mutexLock._M_device._0_1_ = 1;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                (&this->_run,threads,(value_type_conflict1 *)&_mutexLock);
      _mutexLock._M_device._0_1_ = 0;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                (&this->_exit,threads,(value_type_conflict1 *)&_mutexLock);
      pthread_mutex_unlock((pthread_mutex_t *)&this->_taskInfo);
      this->_threadCount = threads;
      while (uVar3 = (long)(this->_worker).
                           super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)(this->_worker).
                           super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                           super__Vector_impl_data._M_start >> 3, uVar3 < threads) {
        local_40 = uVar3;
        local_38 = this;
        std::thread::thread<void(&)(ThreadPool*,unsigned_long),ThreadPool*,unsigned_long,void>
                  ((thread *)&_mutexLock,_workerThread,&local_38,&local_40);
        std::vector<std::thread,_std::allocator<std::thread>_>::emplace_back<std::thread>
                  (&this->_worker,(thread *)&_mutexLock);
        std::thread::~thread((thread *)&_mutexLock);
      }
      std::unique_lock<std::mutex>::unique_lock(&_mutexLock,&this->_creation);
      while (this->_threadsCreated == false) {
        std::condition_variable::wait((unique_lock *)&this->_completeCreation);
      }
      std::unique_lock<std::mutex>::~unique_lock(&_mutexLock);
    }
    else if (threads < uVar3) {
      __mutex = &this->_taskInfo;
      std::mutex::lock(__mutex);
      puVar2 = (this->_exit).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      for (puVar4 = (this->_exit).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start + threads; puVar4 != puVar2;
          puVar4 = puVar4 + 1) {
        *puVar4 = '\x01';
      }
      puVar2 = (this->_run).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      for (puVar4 = (this->_run).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start + threads; puVar4 != puVar2;
          puVar4 = puVar4 + 1) {
        *puVar4 = '\x01';
      }
      std::condition_variable::notify_all();
      while( true ) {
        pthread_mutex_unlock((pthread_mutex_t *)__mutex);
        if ((ulong)((long)(this->_worker).
                          super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)(this->_worker).
                          super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                          super__Vector_impl_data._M_start >> 3) <= threads) break;
        std::thread::join();
        std::vector<std::thread,_std::allocator<std::thread>_>::pop_back(&this->_worker);
        std::mutex::lock(__mutex);
        ppuVar1 = &(this->_exit).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        *ppuVar1 = *ppuVar1 + -1;
        ppuVar1 = &(this->_run).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        *ppuVar1 = *ppuVar1 + -1;
      }
    }
    return;
  }
  this_00 = (imageException *)__cxa_allocate_exception(0x28);
  imageException::imageException(this_00,"Try to set zero threads in thread pool");
  __cxa_throw(this_00,&imageException::typeinfo,imageException::~imageException);
}

Assistant:

void ThreadPool::resize( size_t threads )
{
    if( threads == 0 )
        throw imageException( "Try to set zero threads in thread pool" );

    if( threads > threadCount() ) {
        _taskInfo.lock();
        _run.resize( threads, 1 );
        _exit.resize( threads, 0 );
        _taskInfo.unlock();

        _threadCount = threads;

        while( threads > threadCount() )
            _worker.push_back( std::thread ( ThreadPool::_workerThread, this, threadCount() ) );

        std::unique_lock < std::mutex > _mutexLock( _creation );
        _completeCreation.wait( _mutexLock, [&] { return _threadsCreated; } );
    }
    else if( threads < threadCount() ) {
        _taskInfo.lock();

        std::fill( _exit.begin() + static_cast<std::vector < uint8_t >::difference_type>(threads), _exit.end(), 1 );
        std::fill( _run.begin()  + static_cast<std::vector < uint8_t >::difference_type>(threads), _run.end(), 1 );
        _waiting.notify_all();

        _taskInfo.unlock();

        while( threads < threadCount() ) {
            _worker.back().join();

            _worker.pop_back();

            _taskInfo.lock();

            _exit.pop_back();
            _run.pop_back();

            _taskInfo.unlock();
        }
    }
}